

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineInputFile::compatibilityInitialize(DeepScanLineInputFile *this,IStream *is)

{
  Data *pDVar1;
  MultiPartInputFile *this_00;
  InputPartData *part;
  
  (*is->_vptr_IStream[6])(is,0);
  pDVar1 = this->_data;
  pDVar1->multiPartBackwardSupport = true;
  this_00 = (MultiPartInputFile *)operator_new(0x10);
  MultiPartInputFile::MultiPartInputFile(this_00,is,pDVar1->numThreads,true);
  this->_data->multiPartFile = this_00;
  part = MultiPartInputFile::getPart(this_00,0);
  multiPartInitialize(this,part);
  return;
}

Assistant:

void
DeepScanLineInputFile::compatibilityInitialize(OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is)
{
    is.seekg(0);
    //
    // Construct a MultiPartInputFile, initialize TiledInputFile
    // with the part 0 data.
    // (TODO) maybe change the third parameter of the constructor of MultiPartInputFile later.
    //
    _data->multiPartBackwardSupport = true;
    _data->multiPartFile = new MultiPartInputFile(is, _data->numThreads);
    InputPartData* part = _data->multiPartFile->getPart(0);
    
    multiPartInitialize(part);
}